

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O3

MPP_RET hal_h264e_vepu510_prepare(void *hal)

{
  long lVar1;
  int buf_idx;
  
  lVar1 = *hal;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter %p\n","hal_h264e_vepu510_prepare",hal);
  }
  if ((*(byte *)(lVar1 + 8) & 5) != 0) {
    setup_hal_bufs((HalH264eVepu510Ctx *)hal);
    if (0 < *(int *)((long)hal + 0x30)) {
      buf_idx = 0;
      do {
        hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x18),buf_idx);
        buf_idx = buf_idx + 1;
      } while (buf_idx < *(int *)((long)hal + 0x30));
    }
    *(undefined4 *)(lVar1 + 8) = 0;
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave %p\n","hal_h264e_vepu510_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu510_prepare(void *hal)
{
    HalH264eVepu510Ctx *ctx = (HalH264eVepu510Ctx *)hal;
    MppEncPrepCfg *prep = &ctx->cfg->prep;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (prep->change & (MPP_ENC_PREP_CFG_CHANGE_INPUT | MPP_ENC_PREP_CFG_CHANGE_FORMAT)) {
        RK_S32 i;

        // pre-alloc required buffers to reduce first frame delay
        setup_hal_bufs(ctx);
        for (i = 0; i < ctx->max_buf_cnt; i++)
            hal_bufs_get_buf(ctx->hw_recn, i);

        prep->change = 0;
    }

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}